

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_down_sah_builder.h
# Opt level: O1

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this)

{
  pointer *ppNVar1;
  undefined8 uVar2;
  size_t sVar3;
  iterator __position;
  pointer pBVar4;
  ulong first_id;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar9;
  _Elt_pointer pWVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  ulong extraout_RDX;
  ulong uVar14;
  ulong uVar15;
  pointer pNVar16;
  ulong uVar17;
  float fVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  WorkItem first_item;
  WorkItem second_item;
  stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
  stack;
  undefined1 local_108 [8];
  float fStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  float fStack_f4;
  undefined1 local_e8 [8];
  ulong uStack_e0;
  ulong local_d8;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_c8;
  float local_c0;
  float local_bc;
  _Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
  local_b8;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined4 extraout_var_00;
  
  sVar3 = (this->bboxes_)._M_extent._M_extent_value;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8 = __return_storage_ptr__;
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::reserve(&__return_storage_ptr__->nodes,(sVar3 * 2) / this->config_->min_leaf_size);
  __position._M_current =
       (__return_storage_ptr__->nodes).
       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->nodes).
      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::_M_realloc_insert<>(&__return_storage_ptr__->nodes,__position);
  }
  else {
    ((__position._M_current)->bounds)._M_elems[3] = 0.0;
    ((__position._M_current)->bounds)._M_elems[4] = 0.0;
    *(undefined8 *)(((__position._M_current)->bounds)._M_elems + 5) = 0;
    ((__position._M_current)->bounds)._M_elems[0] = 0.0;
    ((__position._M_current)->bounds)._M_elems[1] = 0.0;
    ((__position._M_current)->bounds)._M_elems[2] = 0.0;
    ((__position._M_current)->bounds)._M_elems[3] = 0.0;
    ppNVar1 = &(__return_storage_ptr__->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  pNVar16 = (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar7 = (**this->_vptr_TopDownSahBuilder)();
  lVar9 = 0;
  do {
    *(undefined4 *)((long)&local_b8._M_impl.super__Deque_impl_data._M_map + lVar9) = 0x7f7fffff;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0xc);
  lVar9 = 0;
  do {
    *(undefined4 *)(local_108 + lVar9) = 0xff7fffff;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0xc);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_b8._M_impl.super__Deque_impl_data._M_map;
  auVar19 = ZEXT464((uint)local_b8._M_impl.super__Deque_impl_data._M_map_size);
  auVar20 = ZEXT416((uint)local_b8._M_impl.super__Deque_impl_data._M_map_size);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_108;
  auVar21 = ZEXT464((uint)fStack_100);
  if (sVar3 != 0) {
    pBVar4 = (this->bboxes_)._M_ptr;
    sVar13 = 0;
    do {
      lVar9 = *(long *)(*(long *)CONCAT44(extraout_var,iVar7) + sVar13 * 8);
      auVar20 = vminss_avx(auVar23,ZEXT416((uint)pBVar4[lVar9].min.values[0]));
      auVar23 = vmovshdup_avx(auVar23);
      auVar23 = vminss_avx(auVar23,ZEXT416((uint)pBVar4[lVar9].min.values[1]));
      auVar23 = vinsertps_avx(auVar20,auVar23,0x10);
      auVar20 = vminss_avx(auVar19._0_16_,ZEXT416((uint)pBVar4[lVar9].min.values[2]));
      auVar19 = ZEXT1664(auVar20);
      auVar25 = vmaxss_avx(auVar24,ZEXT416((uint)pBVar4[lVar9].max.values[0]));
      auVar24 = vmovshdup_avx(auVar24);
      auVar24 = vmaxss_avx(auVar24,ZEXT416((uint)pBVar4[lVar9].max.values[1]));
      auVar24 = vinsertps_avx(auVar25,auVar24,0x10);
      auVar25 = vmaxss_avx(auVar21._0_16_,ZEXT416((uint)pBVar4[lVar9].max.values[2]));
      auVar21 = ZEXT1664(auVar25);
      sVar13 = sVar13 + 1;
    } while (sVar3 != sVar13);
  }
  auVar23 = vunpcklps_avx(auVar23,auVar24);
  *(undefined1 (*) [16])pNVar16[-1].bounds._M_elems = auVar23;
  pNVar16[-1].bounds._M_elems[4] = auVar20._0_4_;
  pNVar16[-1].bounds._M_elems[5] = auVar21._0_4_;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::
  _Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
  ::_M_initialize_map(&local_b8,0);
  local_108 = (undefined1  [8])0x0;
  fStack_100 = 0.0;
  uStack_fc = 0;
  uStack_f8 = (undefined4)sVar3;
  fStack_f4 = (float)(sVar3 >> 0x20);
  std::
  deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
  ::emplace_back<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>
            ((deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
              *)&local_b8,(WorkItem *)local_108);
  do {
    while( true ) {
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        iVar7 = (**this->_vptr_TopDownSahBuilder)();
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  (&__return_storage_ptr__->prim_ids,iVar7);
        if ((__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          __shrink_to_fit_aux<std::vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>,_true>
          ::_S_do_it(&__return_storage_ptr__->nodes);
        }
        std::
        _Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
        ::~_Deque_base(&local_b8);
        return __return_storage_ptr__;
      }
      pWVar10 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar10 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      sVar3 = pWVar10[-1].node_id;
      first_id = pWVar10[-1].begin;
      uVar17 = pWVar10[-1].end;
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x15;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x14;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      pNVar16 = (__return_storage_ptr__->nodes).
                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar3;
      if (this->config_->min_leaf_size < uVar17 - first_id) break;
LAB_001053fe:
      __return_storage_ptr__ = local_c8;
      if (uVar17 == first_id) {
        __assert_fail("prim_count != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                      ,0x41,
                      "static Index<Bits, PrimCountBits> bvh::v2::Index<32, 4>::make_leaf(size_t, size_t) [Bits = 32, PrimCountBits = 4]"
                     );
      }
      Index<32UL,_4UL>::Index((Index<32UL,_4UL> *)local_108,first_id,uVar17 - first_id);
      (pNVar16->index).value = local_108._0_4_;
    }
    auVar23 = vinsertps_avx(ZEXT416((uint)(pNVar16->bounds)._M_elems[0]),
                            ZEXT416((uint)(pNVar16->bounds)._M_elems[2]),0x10);
    fStack_100 = (pNVar16->bounds)._M_elems[4];
    auVar24 = vinsertps_avx(ZEXT416((uint)(pNVar16->bounds)._M_elems[1]),
                            ZEXT416((uint)(pNVar16->bounds)._M_elems[3]),0x10);
    fStack_f4 = (pNVar16->bounds)._M_elems[5];
    local_108 = (undefined1  [8])vmovlps_avx(auVar23);
    uVar2 = vmovlps_avx(auVar24);
    uStack_fc = (undefined4)uVar2;
    uStack_f8 = (undefined4)((ulong)uVar2 >> 0x20);
    iVar7 = (*this->_vptr_TopDownSahBuilder[1])(this,local_108,first_id);
    uVar8 = CONCAT44(extraout_var_00,iVar7);
    if ((extraout_RDX & 1) == 0) goto LAB_001053fe;
    lVar9 = (long)(local_c8->nodes).
                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_c8->nodes).
                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar15 = (lVar9 >> 2) * 0x6db6db6db6db6db7;
    if (0xfffffff < uVar15) {
      __assert_fail("first_id <= static_cast<size_t>(max_first_id)",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                    ,0x4f,
                    "bvh::v2::Index<32, 4>::Index(size_t, size_t) [Bits = 32, PrimCountBits = 4]");
    }
    (pNVar16->index).value = (int)uVar15 << 4;
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::resize(&local_c8->nodes,uVar15 + 2);
    iVar7 = (**this->_vptr_TopDownSahBuilder)();
    lVar11 = 0;
    do {
      *(undefined4 *)(local_108 + lVar11) = 0x7f7fffff;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    lVar11 = 0;
    do {
      *(undefined4 *)(local_e8 + lVar11) = 0xff7fffff;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    local_58._8_8_ = 0;
    local_58._0_8_ = local_108;
    auVar19 = ZEXT464((uint)fStack_100);
    local_68._8_8_ = 0;
    local_68._0_8_ = local_e8;
    auVar21 = ZEXT464((uint)(float)uStack_e0);
    local_c0 = (float)uStack_e0;
    local_bc = fStack_100;
    if (first_id < uVar8) {
      pBVar4 = (this->bboxes_)._M_ptr;
      uVar14 = first_id;
      do {
        lVar11 = *(long *)(*(long *)CONCAT44(extraout_var_01,iVar7) + uVar14 * 8);
        auVar23 = vminss_avx(local_58,ZEXT416((uint)pBVar4[lVar11].min.values[0]));
        auVar24 = vmovshdup_avx(local_58);
        auVar24 = vminss_avx(auVar24,ZEXT416((uint)pBVar4[lVar11].min.values[1]));
        local_58 = vinsertps_avx(auVar23,auVar24,0x10);
        auVar23 = vminss_avx(auVar19._0_16_,ZEXT416((uint)pBVar4[lVar11].min.values[2]));
        auVar19 = ZEXT1664(auVar23);
        local_bc = auVar23._0_4_;
        auVar23 = vmaxss_avx(local_68,ZEXT416((uint)pBVar4[lVar11].max.values[0]));
        auVar24 = vmovshdup_avx(local_68);
        auVar24 = vmaxss_avx(auVar24,ZEXT416((uint)pBVar4[lVar11].max.values[1]));
        local_68 = vinsertps_avx(auVar23,auVar24,0x10);
        auVar23 = vmaxss_avx(auVar21._0_16_,ZEXT416((uint)pBVar4[lVar11].max.values[2]));
        auVar21 = ZEXT1664(auVar23);
        local_c0 = auVar23._0_4_;
        uVar14 = uVar14 + 1;
      } while (uVar8 != uVar14);
    }
    iVar7 = (**this->_vptr_TopDownSahBuilder)();
    __return_storage_ptr__ = local_c8;
    lVar11 = 0;
    do {
      *(undefined4 *)(local_108 + lVar11) = 0x7f7fffff;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    lVar11 = 0;
    do {
      *(undefined4 *)(local_e8 + lVar11) = 0xff7fffff;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_108;
    auVar19 = ZEXT464((uint)fStack_100);
    auVar24 = ZEXT416((uint)fStack_100);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_e8;
    auVar21 = ZEXT464((uint)(float)uStack_e0);
    auVar23 = ZEXT416((uint)(float)uStack_e0);
    if (uVar8 < uVar17) {
      pBVar4 = (this->bboxes_)._M_ptr;
      uVar14 = uVar8;
      do {
        lVar11 = *(long *)(*(long *)CONCAT44(extraout_var_02,iVar7) + uVar14 * 8);
        auVar23 = vminss_avx(auVar20,ZEXT416((uint)pBVar4[lVar11].min.values[0]));
        auVar24 = vmovshdup_avx(auVar20);
        auVar24 = vminss_avx(auVar24,ZEXT416((uint)pBVar4[lVar11].min.values[1]));
        auVar20 = vinsertps_avx(auVar23,auVar24,0x10);
        auVar24 = vminss_avx(auVar19._0_16_,ZEXT416((uint)pBVar4[lVar11].min.values[2]));
        auVar19 = ZEXT1664(auVar24);
        auVar23 = vmaxss_avx(auVar25,ZEXT416((uint)pBVar4[lVar11].max.values[0]));
        auVar25 = vmovshdup_avx(auVar25);
        auVar25 = vmaxss_avx(auVar25,ZEXT416((uint)pBVar4[lVar11].max.values[1]));
        auVar25 = vinsertps_avx(auVar23,auVar25,0x10);
        auVar23 = vmaxss_avx(auVar21._0_16_,ZEXT416((uint)pBVar4[lVar11].max.values[2]));
        auVar21 = ZEXT1664(auVar23);
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
    }
    auVar5 = vsubps_avx(local_68,local_58);
    auVar28 = vmovshdup_avx(auVar5);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar28._0_4_)),
                             ZEXT416((uint)(local_c0 - local_bc)),
                             ZEXT416((uint)(auVar5._0_4_ + auVar28._0_4_)));
    auVar5 = vsubps_avx(auVar25,auVar20);
    auVar28 = vmovshdup_avx(auVar5);
    fVar18 = auVar24._0_4_;
    fVar22 = auVar23._0_4_;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar28._0_4_)),
                              ZEXT416((uint)(fVar22 - fVar18)),
                              ZEXT416((uint)(auVar5._0_4_ + auVar28._0_4_)));
    uVar14 = uVar8;
    uVar12 = first_id;
    uStack_e0 = uVar8;
    auVar24 = local_68;
    auVar28 = local_58;
    fVar29 = fVar18;
    fVar30 = fVar22;
    fVar27 = local_bc;
    fVar26 = local_c0;
    if (auVar6._0_4_ < auVar23._0_4_) {
      uVar14 = uVar17;
      uVar12 = uVar8;
      uStack_e0 = first_id;
      uVar17 = uVar8;
      auVar24 = auVar25;
      auVar28 = auVar20;
      auVar20 = local_58;
      auVar25 = local_68;
      fVar29 = local_bc;
      fVar30 = local_c0;
      fVar27 = fVar18;
      fVar26 = fVar22;
    }
    auVar23 = vunpcklps_avx(auVar20,auVar25);
    auVar24 = vunpcklps_avx(auVar28,auVar24);
    fStack_100 = (float)uVar12;
    uStack_fc = (undefined4)(uVar12 >> 0x20);
    uStack_f8 = (undefined4)uVar14;
    fStack_f4 = (float)(uVar14 >> 0x20);
    local_e8 = (undefined1  [8])(uVar15 + 1);
    pNVar16 = (local_c8->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined1 (*) [16])((long)pNVar16 + lVar9) = auVar24;
    *(float *)((long)pNVar16 + lVar9 + 0x10) = fVar27;
    *(float *)((long)pNVar16 + lVar9 + 0x14) = fVar26;
    lVar9 = uVar15 + 1 + (long)local_e8 * 0x1b;
    *(undefined1 (*) [16])((long)pNVar16 + lVar9) = auVar23;
    *(float *)((long)pNVar16 + lVar9 + 0x10) = fVar29;
    *(float *)((long)pNVar16 + lVar9 + 0x14) = fVar30;
    local_108 = (undefined1  [8])uVar15;
    local_d8 = uVar17;
    if (uVar14 - uVar12 < uVar17 - uStack_e0) {
      fStack_100 = (float)uStack_e0;
      uStack_fc = (undefined4)(uStack_e0 >> 0x20);
      uStack_f8 = (undefined4)uVar17;
      fStack_f4 = (float)(uVar17 >> 0x20);
      local_108 = local_e8;
      local_e8 = (undefined1  [8])uVar15;
      uStack_e0 = uVar12;
      local_d8 = uVar14;
    }
    if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
      ::
      _M_push_back_aux<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem_const&>
                ((deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
                  *)&local_b8,(WorkItem *)local_108);
    }
    else {
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end =
           CONCAT44(fStack_f4,uStack_f8);
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->node_id = (size_t)local_108;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin =
           CONCAT44(uStack_fc,fStack_100);
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
      ::
      _M_push_back_aux<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem_const&>
                ((deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
                  *)&local_b8,(WorkItem *)local_e8);
    }
    else {
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end = local_d8;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->node_id = (size_t)local_e8;
      (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin = uStack_e0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
  } while( true );
}

Assistant:

Bvh<Node> build() {
        const auto prim_count = bboxes_.size();

        Bvh<Node> bvh;
        bvh.nodes.reserve((2 * prim_count) / config_.min_leaf_size);
        bvh.nodes.emplace_back();
        bvh.nodes.back().set_bbox(compute_bbox(0, prim_count));

        std::stack<WorkItem> stack;
        stack.push(WorkItem { 0, 0, prim_count });
        while (!stack.empty()) {
            auto item = stack.top();
            stack.pop();

            auto& node = bvh.nodes[item.node_id];
            if (item.size() > config_.min_leaf_size) {
                if (auto split_pos = try_split(node.get_bbox(), item.begin, item.end)) {
                    auto first_child = bvh.nodes.size();
                    node.index = Node::Index::make_inner(first_child);

                    bvh.nodes.resize(first_child + 2);

                    auto first_bbox   = compute_bbox(item.begin, *split_pos);
                    auto second_bbox  = compute_bbox(*split_pos, item.end);
                    auto first_range  = std::make_pair(item.begin, *split_pos);
                    auto second_range = std::make_pair(*split_pos, item.end);

                    // For "any-hit" queries, the left child is chosen first, so we make sure that
                    // it is the child with the largest area, as it is more likely to contain an
                    // an occluder. See "SATO: Surface Area Traversal Order for Shadow Ray Tracing",
                    // by J. Nah and D. Manocha.
                    if (first_bbox.get_half_area() < second_bbox.get_half_area()) {
                        std::swap(first_bbox, second_bbox);
                        std::swap(first_range, second_range);
                    }

                    auto first_item  = WorkItem { first_child + 0, first_range.first, first_range.second };
                    auto second_item = WorkItem { first_child + 1, second_range.first, second_range.second };
                    bvh.nodes[first_child + 0].set_bbox(first_bbox);
                    bvh.nodes[first_child + 1].set_bbox(second_bbox);

                    // Process the largest child item first, in order to minimize the stack size.
                    if (first_item.size() < second_item.size())
                        std::swap(first_item, second_item);

                    stack.push(first_item);
                    stack.push(second_item);
                    continue;
                }
            }

            node.index = Node::Index::make_leaf(item.begin, item.size());
        }

        bvh.prim_ids = std::move(get_prim_ids());
        bvh.nodes.shrink_to_fit();
        return bvh;
    }